

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  pointer ppVVar1;
  PcodeOp *pPVar2;
  bool bVar3;
  uint4 uVar4;
  uint uVar5;
  ulong uVar6;
  Varnode *pVVar7;
  
  ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(op->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3);
  if ((int)uVar5 < 1) {
    return 0;
  }
  uVar6 = 0;
  uVar4 = 0;
  do {
    pVVar7 = ppVVar1[uVar6];
    do {
      if ((pVVar7->flags & 1) != 0) {
        uVar4 = uVar4 + 1;
        break;
      }
      if ((pVVar7->flags & 0x10) == 0) break;
      pPVar2 = pVVar7->def;
      if (pPVar2 == op) {
        uVar4 = uVar4 + 1;
LAB_002e3bc5:
        bVar3 = false;
      }
      else {
        if (pPVar2->opcode->opcode != CPUI_INDIRECT) goto LAB_002e3bc5;
        pVVar7 = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        bVar3 = true;
      }
    } while (bVar3);
    uVar6 = uVar6 + 1;
    if (uVar6 == (uVar5 & 0x7fffffff)) {
      return uVar4;
    }
  } while( true );
}

Assistant:

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  uint4 res = 0;
  for(int4 i=0;i<op->numInput();++i) {
    Varnode *vn = op->getIn(i);
    for(;;) {
      if (vn->isMark()) {
	res += 1;
	break;
      }
      if (!vn->isWritten()) break;
      PcodeOp *defOp = vn->getDef();
      if (defOp == op) {	// We have looped all the way around
	res += 1;
	break;
      }
      else if (defOp->code() != CPUI_INDIRECT)	// Chain up through INDIRECTs
	break;
      vn = vn->getDef()->getIn(0);
    }
  }
  return res;
}